

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_debug_cform.cxx
# Opt level: O2

xr_surface * __thiscall
dbgcfrm_surface_factory::create_surface(dbgcfrm_surface_factory *this,xr_raw_surface *raw_surface)

{
  xr_surface *this_00;
  xr_gamemtl *pxVar1;
  
  this_00 = (xr_surface *)operator_new(0xd0);
  xray_re::xr_surface::xr_surface(this_00,false);
  std::__cxx11::string::assign((char *)&this_00->m_texture);
  if (this->gamemtls_lib != (xr_gamemtls_lib *)0x0) {
    pxVar1 = xray_re::xr_gamemtls_lib::get_material
                       (this->gamemtls_lib,(uint)(raw_surface->field_0).field_0.gamemtl);
    if (pxVar1 != (xr_gamemtl *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this_00->m_gamemtl);
    }
  }
  if (((raw_surface->field_0).blob64 & 0x8000000000000) != 0) {
    this_00->m_flags = 1;
  }
  return this_00;
}

Assistant:

xr_surface* dbgcfrm_surface_factory::create_surface(const xr_raw_surface& raw_surface) const
{
	xr_surface* surface = new xr_surface;
	surface->texture() = "prop\\prop_fake_kollision";
	if (gamemtls_lib) {
		const xr_gamemtl* gamemtl = gamemtls_lib->get_material(raw_surface.gamemtl);
		if (gamemtl)
			surface->gamemtl() = gamemtl->name;
	}
	if (raw_surface.two_sided())
		surface->set_two_sided();
	return surface;
}